

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O2

bool __thiscall higan::HttpRequest::SetUrl(HttpRequest *this,char *begin,char *end)

{
  size_t in_RCX;
  char *url;
  string local_40;
  
  url = end + -(long)begin;
  if (0 < (long)url) {
    Codec::DecodeUrl_abi_cxx11_(&local_40,(Codec *)begin,url,in_RCX);
    std::__cxx11::string::operator=((string *)&this->url_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return 0 < (long)url;
}

Assistant:

bool HttpRequest::SetUrl(const char* begin, const char* end)
{
	if (end - begin < 1)
	{
		return false;
	}
	url_ = Codec::DecodeUrl(begin, end - begin);

	return true;
}